

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall
ClipperLib::Clipper::CheckHoleLinkages1(Clipper *this,OutRec *outRec1,OutRec *outRec2)

{
  pointer ppOVar1;
  OutRec *pOVar2;
  bool bVar3;
  size_type i;
  ulong uVar4;
  
  for (uVar4 = 0;
      ppOVar1 = (this->m_PolyOuts).
                super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->m_PolyOuts).
                            super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar1 >> 3);
      uVar4 = uVar4 + 1) {
    pOVar2 = ppOVar1[uVar4];
    if (((pOVar2->isHole == true) && (pOVar2->bottomPt != (OutPt *)0x0)) &&
       (pOVar2->FirstLeft == outRec1)) {
      bVar3 = PointInPolygon(&pOVar2->bottomPt->pt,outRec1->pts,
                             (bool)(this->_vptr_Clipper[-3] + 0x10)
                                   [(long)&(this->m_PolyOuts).
                                           super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                   ]);
      if (!bVar3) {
        pOVar2->FirstLeft = outRec2;
      }
    }
  }
  return;
}

Assistant:

void Clipper::CheckHoleLinkages1(OutRec *outRec1, OutRec *outRec2)
{
  //when a polygon is split into 2 polygons, make sure any holes the original
  //polygon contained link to the correct polygon ...
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec *orec = m_PolyOuts[i];
    if (orec->isHole && orec->bottomPt && orec->FirstLeft == outRec1 &&
      !PointInPolygon(orec->bottomPt->pt, outRec1->pts, m_UseFullRange))
        orec->FirstLeft = outRec2;
  }
}